

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collect.c
# Opt level: O2

void pnga_pgroup_gop(Integer p_grp,Integer type,void *x,Integer n,char *op)

{
  int n_00;
  int iVar1;
  
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (p_grp < 1) {
    pnga_gop(type,x,n,op);
    return;
  }
  iVar1 = (int)p_grp;
  n_00 = (int)n;
  switch(type) {
  case 0x3e9:
    armci_msg_group_igop((int *)x,n_00,op,&PGRP_LIST[iVar1].group);
    return;
  case 0x3ea:
    armci_msg_group_lgop((long *)x,n_00,op,&PGRP_LIST[iVar1].group);
    return;
  default:
    pnga_error(" wrong data type ",type);
    return;
  case 0x3ee:
    n = (Integer)(uint)(n_00 * 2);
  case 0x3eb:
    armci_msg_group_fgop((float *)x,(int)n,op,&PGRP_LIST[iVar1].group);
    return;
  case 0x3ef:
    n = (Integer)(uint)(n_00 * 2);
  case 0x3ec:
    armci_msg_group_dgop((double *)x,(int)n,op,&PGRP_LIST[iVar1].group);
    return;
  case 0x3f8:
    armci_msg_group_llgop((longlong *)x,n_00,op,&PGRP_LIST[iVar1].group);
    return;
  }
}

Assistant:

void pnga_pgroup_gop(Integer p_grp, Integer type, void *x, Integer n, char *op)
{
    _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
    if (p_grp > 0) {
#if defined(MSG_COMMS_MPI)
        int group = (int)p_grp;
        switch (type){
            case C_INT:
                armci_msg_group_igop((int*)x, n, op, (&(PGRP_LIST[group].group)));
                break;
            case C_LONG:
                armci_msg_group_lgop((long*)x, n, op, (&(PGRP_LIST[group].group)));
                break;
            case C_LONGLONG:
                armci_msg_group_llgop((long long*)x, n, op, (&(PGRP_LIST[group].group)));
                break;
            case C_FLOAT:
                armci_msg_group_fgop((float*)x, n, op, (&(PGRP_LIST[group].group)));
                break;
            case C_DBL:
                armci_msg_group_dgop((double*)x, n, op, (&(PGRP_LIST[group].group)));
                break;
            case C_SCPL:
                armci_msg_group_fgop((float*)x, 2*n, op, (&(PGRP_LIST[group].group)));
                break;
            case C_DCPL:
                armci_msg_group_dgop((double*)x, 2*n, op, (&(PGRP_LIST[group].group)));
                break;
            default: pnga_error(" wrong data type ",type);
        }
#else
        pnga_error("Groups not implemented for system",0);
#endif
    } else {
        pnga_gop(type, x, n, op);
    }
}